

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O1

void __thiscall timing_registry::startTask(timing_registry *this,uint64_t uid)

{
  int iVar1;
  int64_t iVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  uint64_t local_20;
  
  local_20 = uid;
  iVar2 = query_performance_counter();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    pmVar3 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_timing_registry::task_info>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_timing_registry::task_info>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->tasks,&local_20);
    iVar1 = sched_getcpu();
    pmVar3->startedOnCore_ = iVar1;
    pmVar3->startedAt_ = iVar2;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar4 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

void startTask(uint64_t uid)
    {
        auto t = query_performance_counter();
        std::lock_guard<std::recursive_mutex> __l(m);
        //oqpi_check(tasks.find(name) == tasks.end());
        auto &h = tasks[uid];
        h.startedOnCore_ = oqpi::this_thread::get_current_core();
        h.startedAt_ = t;
    }